

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reactor_impl.h
# Opt level: O1

void __thiscall
iqnet::Reactor<iqnet::Null_lock>::invoke_event_handler
          (Reactor<iqnet::Null_lock> *this,HandlerState *hs)

{
  int iVar1;
  Event_handler *handler;
  bool terminate;
  bool local_19;
  
  local_19 = false;
  handler = find_handler(this,hs->fd);
  if (handler != (Event_handler *)0x0) {
    iVar1 = (*handler->_vptr_Event_handler[6])(handler);
    if ((char)iVar1 == '\0') {
      if ((hs->revents & 1U) == 0) {
        if ((hs->revents & 2U) != 0) {
          (*handler->_vptr_Event_handler[4])(handler,&local_19);
        }
      }
      else {
        (*handler->_vptr_Event_handler[3])(handler,&local_19);
      }
    }
    else {
      invoke_servers_handler(this,handler,hs,&local_19);
    }
    if (local_19 == true) {
      (*(this->super_Reactor_base)._vptr_Reactor_base[4])(this,handler);
      (*handler->_vptr_Event_handler[5])(handler);
    }
    return;
  }
  __assert_fail("handler",
                "/workspace/llm4binary/github/license_c_cmakelists/adedov[P]libiqxmlrpc/libiqxmlrpc/reactor_impl.h"
                ,0xd5,
                "void iqnet::Reactor<iqnet::Null_lock>::invoke_event_handler(Reactor_base::HandlerState &) [Lock = iqnet::Null_lock]"
               );
}

Assistant:

void Reactor<Lock>::invoke_event_handler( Reactor_base::HandlerState& hs )
{
  bool terminate = false;

  Event_handler* handler = find_handler(hs.fd);
  assert(handler);

  if( handler->catch_in_reactor() )
    invoke_servers_handler( handler, hs, terminate );
  else
    invoke_clients_handler( handler, hs, terminate );

  if( terminate )
  {
    unregister_handler( handler );
    handler->finish();
  }
}